

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ParseMapType
          (Parser *this,MapField *map_field,FieldDescriptorProto *field,
          LocationRecorder *type_name_location)

{
  byte *pbVar1;
  uint uVar2;
  bool bVar3;
  char *pcVar4;
  string_view text;
  string_view text_00;
  string_view text_01;
  ErrorMaker error;
  
  uVar2 = *(uint *)&field->field_0;
  if ((char)uVar2 < '\0') {
    pcVar4 = "Map fields are not allowed in oneofs.";
  }
  else if ((uVar2 >> 9 & 1) == 0) {
    if ((uVar2 & 2) == 0) {
      bVar3 = internal::ValidateEnum(3,(uint32_t *)&FieldDescriptorProto_Label_internal_data_);
      if (!bVar3) {
        __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::google::protobuf::FieldDescriptorProto_Label_internal_data_)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.h"
                      ,0x3a33,
                      "void google::protobuf::FieldDescriptorProto::_internal_set_label(::google::protobuf::FieldDescriptorProto_Label)"
                     );
      }
      (field->field_0)._impl_.label_ = 3;
      pbVar1 = (byte *)((long)&field->field_0 + 1);
      *pbVar1 = *pbVar1 | 2;
      text._M_str = "<";
      text._M_len = 1;
      bVar3 = Consume(this,text);
      if ((((bVar3) &&
           (bVar3 = ParseType(this,&map_field->key_type,&map_field->key_type_name), bVar3)) &&
          (text_00._M_str = ",", text_00._M_len = 1, bVar3 = Consume(this,text_00), bVar3)) &&
         ((bVar3 = ParseType(this,&map_field->value_type,&map_field->value_type_name), bVar3 &&
          (text_01._M_str = ">", text_01._M_len = 1, bVar3 = Consume(this,text_01), bVar3)))) {
        RepeatedField<int>::Add(&(type_name_location->location_->field_0)._impl_.path_,6);
        return true;
      }
      return false;
    }
    pcVar4 = "Map fields are not allowed to be extensions.";
  }
  else {
    pcVar4 = "Field labels (required/optional/repeated) are not allowed on map fields.";
  }
  error.func_ = (_func_string_void_ptr *)0x0;
  error.field_0.error_ = pcVar4;
  RecordError(this,error);
  return false;
}

Assistant:

bool Parser::ParseMapType(MapField* map_field, FieldDescriptorProto* field,
                          LocationRecorder& type_name_location) {
  if (field->has_oneof_index()) {
    RecordError("Map fields are not allowed in oneofs.");
    return false;
  }
  if (field->has_label()) {
    RecordError(
        "Field labels (required/optional/repeated) are not allowed on "
        "map fields.");
    return false;
  }
  if (field->has_extendee()) {
    RecordError("Map fields are not allowed to be extensions.");
    return false;
  }
  field->set_label(FieldDescriptorProto::LABEL_REPEATED);
  DO(Consume("<"));
  DO(ParseType(&map_field->key_type, &map_field->key_type_name));
  DO(Consume(","));
  DO(ParseType(&map_field->value_type, &map_field->value_type_name));
  DO(Consume(">"));
  // Defer setting of the type name of the map field until the
  // field name is parsed. Add the source location though.
  type_name_location.AddPath(FieldDescriptorProto::kTypeNameFieldNumber);
  return true;
}